

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_draw_rectangle_rounded_lines
               (rf_rec rec,float roundness,int segments,int line_thick,rf_color color)

{
  float fVar1;
  float fVar2;
  uchar w;
  _Bool _Var3;
  uchar z;
  int i;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  uchar y;
  uchar x;
  long lVar7;
  int line_thick_00;
  bool bVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float in_XMM0_Dc;
  float in_XMM0_Dd;
  float fVar15;
  float __x;
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  float fVar16;
  float fVar17;
  float fVar18;
  float x_00;
  float y_00;
  float x_01;
  float y_01;
  rf_rec rec_00;
  float local_1d4;
  float local_1bc;
  undefined8 local_108;
  float local_100;
  float local_fc;
  undefined8 local_f8;
  float local_f0;
  float local_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8 [7];
  undefined8 local_9c;
  float local_94;
  float local_90;
  float local_8c;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  float fStack_5c;
  float fStack_58;
  float fStack_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  
  fVar16 = rec.width;
  fVar18 = rec.height;
  fVar9 = rec.x;
  fVar14 = rec.y;
  line_thick_00 = 0;
  if (0 < line_thick) {
    line_thick_00 = line_thick;
  }
  if (roundness <= 0.0) {
    rec_00.width = (float)(line_thick_00 * 2) + fVar16;
    rec_00.height = (float)(line_thick_00 * 2) + fVar18;
    rec_00.y = fVar14 - (float)line_thick_00;
    rec_00.x = fVar9 - (float)line_thick_00;
    rf_draw_rectangle_outline(rec_00,line_thick_00,color);
    return;
  }
  fVar17 = 1.0;
  if (roundness <= 1.0) {
    fVar17 = roundness;
  }
  fVar10 = fVar18;
  if (fVar16 <= fVar18) {
    fVar10 = fVar16;
  }
  fVar17 = fVar10 * fVar17 * 0.5;
  if (0.0 < fVar17) {
    uVar5 = (ulong)(uint)segments;
    if (segments < 4) {
      fVar10 = 1.0 - 0.5 / fVar17;
      fVar10 = fVar10 * fVar10;
      fVar10 = acosf(fVar10 + fVar10 + -1.0);
      fVar10 = ceilf(6.2831855 / fVar10);
      uVar5 = 4;
      if (0 < (int)(fVar10 * 0.5)) {
        uVar5 = (ulong)(uint)(int)(fVar10 * 0.5);
      }
    }
    iVar4 = (int)uVar5;
    fVar10 = (float)line_thick_00;
    fVar15 = fVar17 + fVar10;
    fVar16 = fVar16 + fVar9;
    fStack_54 = fVar18 + fVar14;
    x_00 = fVar16 - fVar17;
    y_00 = fStack_54 - fVar17;
    x_01 = fVar17 + fVar9;
    y_01 = fVar17 + fVar14;
    fVar18 = fVar14 - fVar10;
    local_b8[4] = fVar16 + fVar10;
    local_9c = CONCAT44(x_00,y_00);
    local_94 = fStack_54 + fVar10;
    fVar10 = fVar9 - fVar10;
    local_108 = CONCAT44(y_01,x_01);
    local_f8 = CONCAT44(y_00,x_00);
    z = color.b;
    y = color.g;
    x = color.r;
    local_1d4._0_1_ = color.a;
    w = local_1d4._0_1_;
    local_100 = x_00;
    local_fc = y_01;
    local_f0 = x_01;
    local_ec = y_00;
    local_b8[0] = x_01;
    local_b8[1] = fVar18;
    local_b8[2] = x_00;
    local_b8[3] = fVar18;
    local_b8[5] = y_01;
    local_b8[6] = local_b8[4];
    local_90 = x_01;
    local_8c = local_94;
    local_88 = fVar10;
    local_84 = y_00;
    local_80 = fVar10;
    local_7c = y_01;
    local_78 = x_01;
    local_74 = fVar14;
    local_70 = x_00;
    local_6c = fVar14;
    local_68 = fVar16;
    local_64 = y_01;
    local_60 = fVar16;
    fStack_5c = y_00;
    fStack_58 = x_00;
    local_50 = x_01;
    local_4c = fStack_54;
    local_48 = fVar9;
    local_44 = y_00;
    local_40 = fVar9;
    local_3c = y_01;
    if (line_thick < 2) {
      _Var3 = rf_gfx_check_buffer_limit(iVar4 * 8 + 8);
      if (_Var3) {
        rf_gfx_draw();
      }
      rf_gfx_begin(RF_LINES);
      lVar7 = 0;
      if (iVar4 < 1) {
        uVar5 = 0;
      }
      for (; lVar7 != 4; lVar7 = lVar7 + 1) {
        local_1d4 = (float)(&DAT_00170050)[lVar7];
        fVar9 = *(float *)(&local_108 + lVar7);
        fVar14 = *(float *)((long)&local_108 + lVar7 * 8 + 4);
        uVar6 = uVar5;
        while (bVar8 = uVar6 != 0, uVar6 = uVar6 - 1, bVar8) {
          rf_gfx_color4ub(x,y,z,w);
          fVar16 = sinf(local_1d4 * 0.017453292);
          fVar18 = cosf(local_1d4 * 0.017453292);
          rf_gfx_vertex2f(fVar16 * fVar15 + fVar9,fVar18 * fVar15 + fVar14);
          local_1d4 = local_1d4 + 90.0 / (float)iVar4;
          fVar16 = sinf(local_1d4 * 0.017453292);
          fVar18 = cosf(local_1d4 * 0.017453292);
          rf_gfx_vertex2f(fVar16 * fVar15 + fVar9,fVar18 * fVar15 + fVar14);
        }
      }
      for (uVar5 = 0; uVar5 < 8; uVar5 = uVar5 + 2) {
        rf_gfx_color4ub(x,y,z,w);
        rf_gfx_vertex2f(local_b8[uVar5 * 2],local_b8[uVar5 * 2 + 1]);
        rf_gfx_vertex2f(local_b8[uVar5 * 2 + 2],local_b8[uVar5 * 2 + 3]);
      }
    }
    else {
      local_e8 = local_b8[4];
      fStack_e4 = fStack_54;
      fStack_e0 = in_XMM1_Dc + in_XMM0_Dc;
      fStack_dc = in_XMM1_Dd + in_XMM0_Dd;
      local_d8 = fStack_54;
      fStack_d4 = fStack_54;
      fStack_d0 = fStack_54;
      fStack_cc = fStack_54;
      local_c8 = local_94;
      fStack_c4 = fStack_54;
      fStack_c0 = fStack_54;
      fStack_bc = fStack_54;
      _Var3 = rf_gfx_check_buffer_limit(iVar4 * 0x18 + 0x18);
      if (_Var3) {
        rf_gfx_draw();
      }
      rf_gfx_begin(RF_TRIANGLES);
      lVar7 = 0;
      if (iVar4 < 1) {
        uVar5 = 0;
      }
      for (; lVar7 != 4; lVar7 = lVar7 + 1) {
        local_1bc = (float)(&DAT_00170050)[lVar7];
        fVar1 = *(float *)(&local_108 + lVar7);
        fVar2 = *(float *)((long)&local_108 + lVar7 * 8 + 4);
        uVar6 = uVar5;
        while (bVar8 = uVar6 != 0, uVar6 = uVar6 - 1, bVar8) {
          rf_gfx_color4ub(x,y,z,local_1d4._0_1_);
          __x = local_1bc * 0.017453292;
          fVar11 = sinf(__x);
          fVar12 = cosf(__x);
          rf_gfx_vertex2f(fVar11 * fVar17 + fVar1,fVar12 * fVar17 + fVar2);
          fVar11 = sinf(__x);
          fVar12 = cosf(__x);
          rf_gfx_vertex2f(fVar11 * fVar15 + fVar1,fVar12 * fVar15 + fVar2);
          local_1bc = local_1bc + 90.0 / (float)iVar4;
          fVar11 = local_1bc * 0.017453292;
          fVar12 = sinf(fVar11);
          fVar13 = cosf(fVar11);
          rf_gfx_vertex2f(fVar12 * fVar17 + fVar1,fVar13 * fVar17 + fVar2);
          fVar12 = sinf(fVar11);
          fVar13 = cosf(fVar11);
          rf_gfx_vertex2f(fVar12 * fVar17 + fVar1,fVar13 * fVar17 + fVar2);
          fVar12 = sinf(__x);
          fVar13 = cosf(__x);
          rf_gfx_vertex2f(fVar12 * fVar15 + fVar1,fVar13 * fVar15 + fVar2);
          fVar12 = sinf(fVar11);
          fVar11 = cosf(fVar11);
          rf_gfx_vertex2f(fVar12 * fVar15 + fVar1,fVar11 * fVar15 + fVar2);
        }
      }
      rf_gfx_color4ub(x,y,z,local_1d4._0_1_);
      rf_gfx_vertex2f(x_01,fVar18);
      rf_gfx_vertex2f(x_01,fVar14);
      rf_gfx_vertex2f(x_00,fVar14);
      rf_gfx_vertex2f(x_00,fVar18);
      rf_gfx_vertex2f(x_01,fVar18);
      rf_gfx_vertex2f(x_00,fVar14);
      rf_gfx_color4ub(x,y,z,local_1d4._0_1_);
      rf_gfx_vertex2f(fVar16,y_01);
      rf_gfx_vertex2f(fVar16,y_00);
      rf_gfx_vertex2f(local_e8,y_00);
      rf_gfx_vertex2f(local_e8,y_01);
      rf_gfx_vertex2f(fVar16,y_01);
      rf_gfx_vertex2f(local_e8,y_00);
      rf_gfx_color4ub(x,y,z,local_1d4._0_1_);
      rf_gfx_vertex2f(x_01,local_d8);
      rf_gfx_vertex2f(x_01,local_c8);
      rf_gfx_vertex2f(x_00,local_c8);
      rf_gfx_vertex2f(x_00,local_d8);
      rf_gfx_vertex2f(x_01,local_d8);
      rf_gfx_vertex2f(x_00,local_c8);
      rf_gfx_color4ub(x,y,z,local_1d4._0_1_);
      rf_gfx_vertex2f(fVar10,y_01);
      rf_gfx_vertex2f(fVar10,y_00);
      rf_gfx_vertex2f(fVar9,y_00);
      rf_gfx_vertex2f(fVar9,y_01);
      rf_gfx_vertex2f(fVar10,y_01);
      rf_gfx_vertex2f(fVar9,y_00);
    }
    rf_gfx_end();
  }
  return;
}

Assistant:

RF_API void rf_draw_rectangle_rounded_lines(rf_rec rec, float roundness, int segments, int line_thick, rf_color color)
{
    if (line_thick < 0) line_thick = 0;

    // Not a rounded rectangle
    if (roundness <= 0.0f)
    {
        rf_draw_rectangle_outline((rf_rec) {rec.x - line_thick, rec.y - line_thick, rec.width + 2 * line_thick, rec.height + 2 * line_thick}, line_thick, color);
        return;
    }

    if (roundness >= 1.0f) roundness = 1.0f;

    // Calculate corner radius
    float radius = (rec.width > rec.height)? (rec.height*roundness)/2 : (rec.width*roundness)/2;
    if (radius <= 0.0f) return;

    // Calculate number of segments to use for the corners
    if (segments < 4)
    {
        // Calculate how many segments we need to draw a smooth circle, taken from https://stackoverflow.com/a/2244088

        float CIRCLE_ERROR_RATE = 0.5f;

        // Calculate the maximum angle between segments based on the error rate.
        float th = acosf(2*powf(1 - CIRCLE_ERROR_RATE/radius, 2) - 1);
        segments = ceilf(2 * RF_PI / th) / 2;
        if (segments <= 0) segments = 4;
    }

    float step_length = 90.0f/(float)segments;
    const float outer_radius = radius + (float)line_thick, inner_radius = radius;

    /*  Quick sketch to make sense of all of this (mark the 16 + 4(corner centers P16-19) points we'll use below)
     *  Not my best attempt at ASCII art, just preted it's rounded rectangle :)
     *     P0                     P1
     *        ====================
     *     // P8                P9 \
     *    //                        \
     *P7 // P15                  P10 \\ P2
        \\ P2
     *  ||   *P16             P17*    ||
     *  ||                            ||
     *  || P14                   P11  ||
     *P6 \\  *P19             P18*   // P3
     *    \\                        //
     *     \\ P13              P12 //
     *        ====================
     *     P5                     P4

     */
    const rf_vec2 point[16] =
            {
                    {(float)rec.x + inner_radius, rec.y - line_thick}, {(float)(rec.x + rec.width) - inner_radius, rec.y - line_thick}, { rec.x + rec.width + line_thick, (float)rec.y + inner_radius }, // PO, P1, P2
                    {rec.x + rec.width + line_thick, (float)(rec.y + rec.height) - inner_radius}, {(float)(rec.x + rec.width) - inner_radius, rec.y + rec.height + line_thick}, // P3, P4
                    {(float)rec.x + inner_radius, rec.y + rec.height + line_thick}, { rec.x - line_thick, (float)(rec.y + rec.height) - inner_radius}, {rec.x - line_thick, (float)rec.y + inner_radius}, // P5, P6, P7
                    {(float)rec.x + inner_radius, rec.y}, {(float)(rec.x + rec.width) - inner_radius, rec.y}, // P8, P9
                    { rec.x + rec.width, (float)rec.y + inner_radius }, {rec.x + rec.width, (float)(rec.y + rec.height) - inner_radius}, // P10, P11
                    {(float)(rec.x + rec.width) - inner_radius, rec.y + rec.height}, {(float)rec.x + inner_radius, rec.y + rec.height}, // P12, P13
                    { rec.x, (float)(rec.y + rec.height) - inner_radius}, {rec.x, (float)rec.y + inner_radius} // P14, P15
            };

    const rf_vec2 centers[4] =
            {
                    {(float)rec.x + inner_radius, (float)rec.y + inner_radius}, {(float)(rec.x + rec.width) - inner_radius, (float)rec.y + inner_radius}, // P16, P17
                    {(float)(rec.x + rec.width) - inner_radius, (float)(rec.y + rec.height) - inner_radius}, {(float)rec.x + inner_radius, (float)(rec.y + rec.height) - inner_radius} // P18, P19
            };

    const float angles[4] = { 180.0f, 90.0f, 0.0f, 270.0f };

    if (line_thick > 1)
    {
        if (rf_gfx_check_buffer_limit(4 * 6*segments + 4 * 6)) rf_gfx_draw(); // 4 corners with 6(2 * 3) vertices for each segment + 4 rectangles with 6 vertices each

        rf_gfx_begin(RF_TRIANGLES);

        // Draw all of the 4 corners first: Upper Left Corner, Upper Right Corner, Lower Right Corner, Lower Left Corner
        for (rf_int k = 0; k < 4; ++k) // Hope the compiler is smart enough to unroll this loop
        {
            float angle = angles[k];
            const rf_vec2 center = centers[k];

            for (rf_int i = 0; i < segments; i++)
            {
                rf_gfx_color4ub(color.r, color.g, color.b, color.a);

                rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*inner_radius, center.y + cosf(RF_DEG2RAD*angle)*inner_radius);
                rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*outer_radius, center.y + cosf(RF_DEG2RAD*angle)*outer_radius);
                rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*(angle + step_length))*inner_radius, center.y + cosf(RF_DEG2RAD*(angle + step_length))*inner_radius);

                rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*(angle + step_length))*inner_radius, center.y + cosf(RF_DEG2RAD*(angle + step_length))*inner_radius);
                rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*outer_radius, center.y + cosf(RF_DEG2RAD*angle)*outer_radius);
                rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*(angle + step_length))*outer_radius, center.y + cosf(RF_DEG2RAD*(angle + step_length))*outer_radius);

                angle += step_length;
            }
        }

        // Upper rectangle
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);
        rf_gfx_vertex2f(point[0].x, point[0].y);
        rf_gfx_vertex2f(point[8].x, point[8].y);
        rf_gfx_vertex2f(point[9].x, point[9].y);
        rf_gfx_vertex2f(point[1].x, point[1].y);
        rf_gfx_vertex2f(point[0].x, point[0].y);
        rf_gfx_vertex2f(point[9].x, point[9].y);

        // Right rectangle
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);
        rf_gfx_vertex2f(point[10].x, point[10].y);
        rf_gfx_vertex2f(point[11].x, point[11].y);
        rf_gfx_vertex2f(point[3].x, point[3].y);
        rf_gfx_vertex2f(point[2].x, point[2].y);
        rf_gfx_vertex2f(point[10].x, point[10].y);
        rf_gfx_vertex2f(point[3].x, point[3].y);

        // Lower rectangle
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);
        rf_gfx_vertex2f(point[13].x, point[13].y);
        rf_gfx_vertex2f(point[5].x, point[5].y);
        rf_gfx_vertex2f(point[4].x, point[4].y);
        rf_gfx_vertex2f(point[12].x, point[12].y);
        rf_gfx_vertex2f(point[13].x, point[13].y);
        rf_gfx_vertex2f(point[4].x, point[4].y);

        // Left rectangle
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);
        rf_gfx_vertex2f(point[7].x, point[7].y);
        rf_gfx_vertex2f(point[6].x, point[6].y);
        rf_gfx_vertex2f(point[14].x, point[14].y);
        rf_gfx_vertex2f(point[15].x, point[15].y);
        rf_gfx_vertex2f(point[7].x, point[7].y);
        rf_gfx_vertex2f(point[14].x, point[14].y);
        rf_gfx_end();

    }
    else
    {
        // Use LINES to draw the outline
        if (rf_gfx_check_buffer_limit(8*segments + 4 * 2)) rf_gfx_draw(); // 4 corners with 2 vertices for each segment + 4 rectangles with 2 vertices each

        rf_gfx_begin(RF_LINES);

        // Draw all of the 4 corners first: Upper Left Corner, Upper Right Corner, Lower Right Corner, Lower Left Corner
        for (rf_int k = 0; k < 4; ++k) // Hope the compiler is smart enough to unroll this loop
        {
            float angle = angles[k];
            const rf_vec2 center = centers[k];

            for (rf_int i = 0; i < segments; i++)
            {
                rf_gfx_color4ub(color.r, color.g, color.b, color.a);
                rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*angle)*outer_radius, center.y + cosf(RF_DEG2RAD*angle)*outer_radius);
                rf_gfx_vertex2f(center.x + sinf(RF_DEG2RAD*(angle + step_length))*outer_radius, center.y + cosf(RF_DEG2RAD*(angle + step_length))*outer_radius);
                angle += step_length;
            }
        }
        // And now the remaining 4 lines
        for(int i = 0; i < 8; i += 2)
        {
            rf_gfx_color4ub(color.r, color.g, color.b, color.a);
            rf_gfx_vertex2f(point[i].x, point[i].y);
            rf_gfx_vertex2f(point[i + 1].x, point[i + 1].y);
        }
        rf_gfx_end();
    }
}